

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ostream *poVar5;
  int iVar6;
  undefined1 local_218 [8];
  char buffer [256];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  int local_94;
  _Alloc_hider local_90;
  Message error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_2a;
  char local_29 [8];
  char flag;
  
  do {
    sVar3 = read(this->read_fd_,local_29,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00136978;
      }
      if (iVar1 == 1) {
        if (local_29[0] == 'I') {
          iVar1 = this->read_fd_;
          Message::Message((Message *)&stack0xffffffffffffff70);
          goto LAB_00136aa2;
        }
        if (local_29[0] == 'L') {
          this->outcome_ = LIVED;
        }
        else if (local_29[0] == 'T') {
          this->outcome_ = THREW;
        }
        else if (local_29[0] == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)local_218,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                             ,0x1d1);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar5 = std::operator<<(poVar5,"unexpected status byte (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,")");
          GTestLog::~GTestLog((GTestLog *)local_218);
        }
        goto LAB_00136978;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_50,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar5,(string *)local_218);
  std::__cxx11::string::~string((string *)local_218);
  GTestLog::~GTestLog((GTestLog *)&local_50);
  goto LAB_00136978;
  while( true ) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    if (iVar6 != 4) break;
LAB_00136aa2:
    while( true ) {
      sVar3 = read(iVar1,local_218,0xff);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      local_218[uVar2 & 0x7fffffff] = 0;
      std::operator<<((ostream *)(local_90._M_p + 0x10),local_218);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_70,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                           ,0x150);
        StringStreamToString(&local_50,(stringstream *)local_90._M_p);
        std::operator<<((ostream *)&std::cerr,(string *)&local_50);
        goto LAB_00136c0d;
      }
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_70,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x153);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&local_50);
  poVar5 = std::operator<<(poVar5," [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  std::operator<<(poVar5,"]");
LAB_00136c0d:
  std::__cxx11::string::~string((string *)&local_50);
  GTestLog::~GTestLog((GTestLog *)&local_70);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&stack0xffffffffffffff70);
LAB_00136978:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) goto LAB_00136a5f;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  std::__cxx11::string::string((string *)&local_d8,"CHECK failed: File ",&local_2a);
  std::operator+(&local_f8,&local_d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_f8,", line ");
  local_94 = 0x1d9;
  StreamableToString<int>(&local_b8,&local_94);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (buffer + 0xf8),&local_b8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff70,&local_70,": ");
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff70,"posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 &local_50," != -1");
  DeathTestAbort((string *)local_218);
LAB_00136a5f:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}